

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassTemplate.h
# Opt level: O3

void __thiscall
kiste::ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_header<kiste::class_t>
          (ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,size_t line_no
          ,class_t *class_data)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,
             "template<typename DERIVED_T, typename DATA_T, typename SERIALIZER_T>\nstruct ",0x4c);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"_t\n",3);
  if ((class_data->_parent_name)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"  : public ",0xb);
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_parent_name);
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"_t<",3);
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_name);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"_t<DERIVED_T, DATA_T, SERIALIZER_T>, DATA_T, SERIALIZER_T>\n",
               0x3b);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"{\n",2);
  if ((class_data->_parent_name)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"  using _parent_t = ",0x14);
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_parent_name);
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"_t<",3);
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_name);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"_t, DATA_T, SERIALIZER_T>;\n  _parent_t& parent;\n",0x30);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,
             "  DERIVED_T& child;\n  using _data_t = DATA_T;\n  const _data_t& data;\n  using _serializer_t = SERIALIZER_T;\n  _serializer_t& _serialize;\n\n  "
             ,0x8b);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,
             "_t(DERIVED_T& derived, const DATA_T& data_, SERIALIZER_T& serialize):\n",0x46);
  if ((class_data->_parent_name)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"    _parent_t{*this, data_, serialize},\n    parent(*this),\n"
               ,0x3b);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,
             "    child(derived),\n    data(data_),\n    _serialize(serialize)\n  {}\n",0x44);
  line_directive(this,line_no + 1);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\n",1);
  return;
}

Assistant:

void render_header(const size_t line_no, const ClassData& class_data)
    {
    _serialize.text("template<typename DERIVED_T, typename DATA_T, typename SERIALIZER_T>\n"
                    "struct ");_serialize.escape(class_data._name);_serialize.text("_t\n");
      if (!class_data._parent_name.empty())
      {
      _serialize.text("  : public ");_serialize.escape(class_data._parent_name);_serialize.text("_t<");_serialize.escape(class_data._name);_serialize.text("_t<DERIVED_T, DATA_T, SERIALIZER_T>, DATA_T, SERIALIZER_T>\n");
      }
    _serialize.text("{\n");
      if (!class_data._parent_name.empty())
      {
      _serialize.text("  using _parent_t = ");_serialize.escape(class_data._parent_name);_serialize.text("_t<");_serialize.escape(class_data._name);_serialize.text("_t, DATA_T, SERIALIZER_T>;\n"
                      "  _parent_t& parent;\n");
      }
    _serialize.text("  DERIVED_T& child;\n"
                    "  using _data_t = DATA_T;\n"
                    "  const _data_t& data;\n"
                    "  using _serializer_t = SERIALIZER_T;\n"
                    "  _serializer_t& _serialize;\n"
                    "\n"
                    "  ");_serialize.escape(class_data._name);_serialize.text("_t(DERIVED_T& derived, const DATA_T& data_, SERIALIZER_T& serialize):\n");
      if (!class_data._parent_name.empty())
      {
      _serialize.text("    _parent_t{*this, data_, serialize},\n"
                      "    parent(*this),\n");
      }
    _serialize.text("    child(derived),\n"
                    "    data(data_),\n"
                    "    _serialize(serialize)\n"
                    "  {}\n");
    static_assert(std::is_same<decltype(line_directive(line_no + 1)), void>::value, "$call{} requires void expression"); (line_directive(line_no + 1));_serialize.text("\n");
    }